

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::PushPopFrameHelper::PushPopFrameHelper
          (PushPopFrameHelper *this,InterpreterStackFrame *interpreterFrame,void *returnAddress,
          void *addressOfReturnAddress)

{
  bool bVar1;
  ScriptContext *this_00;
  ThreadContext *pTVar2;
  FunctionBody *this_01;
  void *addressOfReturnAddress_local;
  void *returnAddress_local;
  InterpreterStackFrame *interpreterFrame_local;
  PushPopFrameHelper *this_local;
  
  this_00 = InterpreterStackFrame::GetScriptContext(interpreterFrame);
  pTVar2 = ScriptContext::GetThreadContext(this_00);
  this->m_threadContext = pTVar2;
  this->m_interpreterFrame = interpreterFrame;
  this->m_isHiddenFrame = false;
  *(void **)(interpreterFrame + 0x98) = returnAddress;
  *(void **)(interpreterFrame + 0xa0) = addressOfReturnAddress;
  this_01 = InterpreterStackFrame::GetFunctionBody(interpreterFrame);
  bVar1 = ParseableFunctionInfo::GetIsAsmjsMode(&this_01->super_ParseableFunctionInfo);
  if (bVar1) {
    this->m_isHiddenFrame = true;
  }
  else {
    ThreadContext::PushInterpreterFrame(this->m_threadContext,interpreterFrame);
  }
  return;
}

Assistant:

PushPopFrameHelper(InterpreterStackFrame *interpreterFrame, void *returnAddress, void *addressOfReturnAddress)
                : m_threadContext(interpreterFrame->GetScriptContext()->GetThreadContext()), m_interpreterFrame(interpreterFrame), m_isHiddenFrame(false)
            {
                interpreterFrame->returnAddress = returnAddress; // Ensure these are set before pushing to interpreter frame list
                interpreterFrame->addressOfReturnAddress = addressOfReturnAddress;
                if (interpreterFrame->GetFunctionBody()->GetIsAsmjsMode())
                {
                    m_isHiddenFrame = true;
                }
                else
                {
                    m_threadContext->PushInterpreterFrame(interpreterFrame);
                }
            }